

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PreIncTestInt16(void)

{
  bool expected;
  short t;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *pSVar1;
  long lVar2;
  allocator local_51;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 4; lVar2 != 0x3a; lVar2 = lVar2 + 6) {
    t = *(short *)(&UNK_0015ab4c + lVar2);
    si.m_int = t;
    pSVar1 = SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator++(&si);
    expected = *(bool *)((long)&inc_int16 + lVar2);
    if ((pSVar1->m_int == *(short *)(&UNK_0015ab4e + lVar2)) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case inc_int16 throw (1): ",&local_51);
      err_msg<short>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PreIncTestInt16()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_int16); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int16_t > si(inc_int16[i].x);
			SafeInt< std::int16_t > vv = ++si;

			if(vv != inc_int16[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_int16[i].fExpected )
		{
			err_msg( "Error in case inc_int16 throw (1): ", inc_int16[i].x, inc_int16[i].fExpected );
		}
	}
}